

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O3

void __thiscall nite::NavUI::update(NavUI *this,BaseUIComponent *comp)

{
  byte bVar1;
  long *plVar2;
  element_type *peVar3;
  byte bVar4;
  bool bVar5;
  uint key;
  BaseUIComponent *pBVar6;
  undefined8 uVar7;
  pointer psVar8;
  int iVar9;
  int iVar10;
  _Hash_node_base *p_Var11;
  long lVar12;
  ulong uVar13;
  float Step;
  BaseUIComponent *local_98;
  anon_class_16_2_3ef9e608 getSelectedChild;
  undefined1 local_78 [16];
  BaseUIComponent *local_68;
  ListenerInfo *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  anon_class_16_2_044dc475 solveAutoScroll;
  BaseUIComponent *local_38;
  BaseUIComponent *comp_local;
  
  if (comp == (BaseUIComponent *)0x0) {
    return;
  }
  local_98 = (BaseUIComponent *)&stack0xffffffffffffffc8;
  solveAutoScroll.comp = &local_98;
  if (this->colorFlip == 0) {
    Step = 0.11;
  }
  else {
    Step = 0.34;
  }
  getSelectedChild.comp = (BaseUIComponent **)this;
  local_50 = (undefined1  [8])local_98;
  local_38 = comp;
  solveAutoScroll.getSelectedChild._7_1_ =
       Color::cInterpDiscrete
                 (&this->color,(Color *)((long)&(this->a).r + (ulong)((this->colorFlip ^ 1) << 4)),
                  Step);
  if ((local_38->visible == true) &&
     (p_Var11 = (local_38->keyListeners)._M_h._M_before_begin._M_nxt,
     p_Var11 != (_Hash_node_base *)0x0)) {
    do {
      getSelectedChild.this = (NavUI *)local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&getSelectedChild.this,p_Var11[1]._M_nxt,
                 (long)&(p_Var11[1]._M_nxt)->_M_nxt + (long)&(p_Var11[2]._M_nxt)->_M_nxt);
      key = translateKey((string *)&getSelectedChild.this);
      bVar5 = keyboardPressed(key);
      if (getSelectedChild.this != (NavUI *)local_78) {
        operator_delete(getSelectedChild.this);
      }
      if (bVar5) {
        local_60 = (ListenerInfo *)operator_new(1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<nite::ListenerInfo*>
                  (&local_58,local_60);
        local_68 = local_38;
        if (p_Var11[7]._M_nxt == (_Hash_node_base *)0x0) {
          uVar7 = std::__throw_bad_function_call();
          if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
          }
          _Unwind_Resume(uVar7);
        }
        (*(code *)p_Var11[8]._M_nxt)(p_Var11 + 5,&local_60,&local_68);
        if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
        }
      }
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  bVar4 = solveAutoScroll.getSelectedChild._7_1_;
  bVar1 = this->enable;
  if ((solveAutoScroll.getSelectedChild._7_1_ & bVar1) == 1) {
    this->colorFlip = (bool)(this->colorFlip ^ 1);
    (*local_38->_vptr_BaseUIComponent[7])();
    bVar1 = this->enable;
  }
  if (((bVar4 | ~bVar1) & 1) == 0) {
    (*local_38->_vptr_BaseUIComponent[7])();
    bVar1 = this->enable;
  }
  if ((((bVar1 & 1) != 0) && (bVar5 = keyboardPressed(local_38->onClickAnalogueKey), bVar5)) &&
     (psVar8 = (local_38->children).
               super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (local_38->children).
     super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar8)) {
    lVar12 = 0;
    uVar13 = 0;
    pBVar6 = local_38;
    do {
      plVar2 = *(long **)((long)&(psVar8->
                                 super___shared_ptr<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar12);
      if ((int)plVar2[0xc] == this->current) {
        (**(code **)(*plVar2 + 0x50))();
        pBVar6 = local_38;
      }
      uVar13 = uVar13 + 1;
      psVar8 = (pBVar6->children).
               super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (ulong)((long)(pBVar6->children).
                                    super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  if ((this->enable == true) && (bVar5 = keyboardPressed(0x48), bVar5)) {
    peVar3 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar5 = peVar3->yorient;
    if (peVar3->xorient == true) {
      if (bVar5 == false) {
LAB_001b66e8:
        uVar13 = (long)this->current + 1;
        iVar10 = (int)uVar13;
        if ((ulong)((long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar13) {
          iVar10 = this->current;
        }
        this->current = iVar10;
      }
      else if (this->split != 0) {
        iVar10 = this->current;
        uVar13 = (long)iVar10 + 1;
        iVar9 = iVar10;
        if (((int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) %
                  (long)this->split) != 0) &&
           (iVar9 = (int)uVar13,
           ((long)(local_38->children).
                  super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_38->children).
                  super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < uVar13)) {
          iVar9 = iVar10;
        }
        this->current = iVar9;
      }
    }
    else if (bVar5 != false) goto LAB_001b66e8;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((this->enable == true) && (bVar5 = keyboardPressed(0x47), bVar5)) {
    peVar3 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar5 = peVar3->yorient;
    if (peVar3->xorient == true) {
      if (bVar5 == false) {
LAB_001b6772:
        this->current = this->current - (uint)(0 < this->current);
      }
      else if (this->split != 0) {
        iVar10 = this->current;
        this->current = iVar10 + -1;
        if ((iVar10 < 1) || (iVar10 % this->split == 0)) {
          this->current = iVar10;
        }
      }
    }
    else if (bVar5 != false) goto LAB_001b6772;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((this->enable == true) && (bVar5 = keyboardPressed(0x4a), bVar5)) {
    peVar3 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar5 = peVar3->yorient;
    if (peVar3->xorient == true) {
      if (bVar5 == false) {
LAB_001b67f9:
        this->current =
             this->current +
             (uint)((long)this->index + 1U <
                   (ulong)((long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      else if (this->split != 0) {
        iVar10 = this->current;
        iVar9 = this->split + iVar10;
        this->current = iVar9;
        if (((long)(local_38->children).
                   super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_38->children).
                   super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < (ulong)(long)iVar9) {
          this->current = iVar10;
        }
      }
    }
    else if (bVar5 != false) goto LAB_001b67f9;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if (this->enable != true) {
    return;
  }
  bVar5 = keyboardPressed(0x49);
  if (!bVar5) {
    return;
  }
  peVar3 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar5 = peVar3->yorient;
  if (peVar3->xorient == true) {
    if (bVar5 != false) {
      if (this->split != 0) {
        iVar10 = this->current - this->split;
        if (iVar10 < 0) {
          iVar10 = this->current;
        }
        this->current = iVar10;
      }
      goto LAB_001b687c;
    }
  }
  else if (bVar5 == false) goto LAB_001b687c;
  this->current = this->current - (uint)(0 < this->index);
LAB_001b687c:
  update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
  (*local_38->_vptr_BaseUIComponent[7])();
  return;
}

Assistant:

void nite::NavUI::update(BaseUIComponent *comp){
    if(comp == NULL){
        return;
    }

    auto getSelectedChild = [&](){
        for(int i = 0; i < comp->children.size(); ++i){
            if(comp->children[i]->nav.index == current){
                return comp->children[i];
            }
        }
        return Shared<nite::BaseUIComponent>(NULL);
    };

    auto solveAutoScroll = [&](){
        if(!comp->allowOverflow){
            return;
        }
        auto child = getSelectedChild();
        if(child.get() == NULL){
            return;
        }
        auto space = comp->computeSize();
        auto area = child->computeSize();
        auto p = child->position + comp->scrollOffset;
        if( p.x + area.x * 0.5f <= 0.0f || p.y + area.y * 0.5f <= 0.0f || 
            p.x - area.x * 0.5f >= space.x || p.y - area.y * 0.5f >= space.y ||
            p.x - area.x * 0.5f < 0.0f || p.y - area.y * 0.5f < 0.0f || 
            p.x + area.x * 0.5f > space.x || p.y + area.y * 0.5f > space.y){
            // TODO: this is going to change to accodomate vinline (instead of left to right, top to bottom)
            // see commented line below
            comp->scrollOffset.y = -(child->position.y - area.y * 0.5f) + area.y;
            //comp->scrollOffset.x = -(child->position.x - area.x * 0.5f);
            comp->recalculate();
        }        
    };

	auto lrpUpd = color.cInterpDiscrete(colorFlip ? a : b, colorFlip ? 0.34f : 0.11f);

	if(comp->visible){
		for(auto &key : comp->keyListeners){
			if(nite::keyboardPressed(nite::translateKey(key.first))){
				key.second(Shared<nite::ListenerInfo>(new nite::ListenerInfo()), comp);
			}
		}		
	}

	if(enable && lrpUpd){
		colorFlip = !colorFlip;
		comp->recalculate();
	}

	if(enable && !lrpUpd){
		comp->recalculate();	
	}

	if(enable && nite::keyboardPressed(comp->onClickAnalogueKey)){
		for(int i = 0; i < comp->children.size(); ++i){
			if(comp->children[i]->nav.index == current){
				comp->children[i]->onClick();
			}
		}
	}

	if(enable && nite::keyboardPressed(nite::keyRIGHT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current = (current + 1) % split == 0 || (current + 1) > comp->children.size()-1 ? current : current + 1;
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyLEFT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			--current;
			if(current < 0 || (current + 1) % split == 0){
				++current;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyDOWN)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current += split;
			if(current > comp->children.size()-1){
				current -= split;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}	


	if(enable && nite::keyboardPressed(nite::keyUP)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current -= split;
			if(current < 0){
				current += split;
			}
		}	      
        solveAutoScroll();	
		comp->recalculate();
	}
}